

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.h
# Opt level: O0

void __thiscall
Jinx::StaticArena<1024UL,_16UL>::deallocate(StaticArena<1024UL,_16UL> *this,char *p,size_t n)

{
  bool bVar1;
  size_t sVar2;
  size_t n_local;
  char *p_local;
  StaticArena<1024UL,_16UL> *this_local;
  
  bVar1 = pointer_in_buffer(this,this->m_ptr);
  if (bVar1) {
    bVar1 = pointer_in_buffer(this,p);
    if (bVar1) {
      sVar2 = align_up(n);
      if (p + sVar2 == this->m_ptr) {
        this->m_ptr = p;
      }
    }
    else {
      MemFree(p,n);
    }
    return;
  }
  __assert_fail("pointer_in_buffer(m_ptr) && \"short_alloc has outlived arena\"",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxMemory.h"
                ,99,
                "void Jinx::StaticArena<1024>::deallocate(char *, std::size_t) [N = 1024, alignment = 16]"
               );
}

Assistant:

void StaticArena<N, alignment>::deallocate(char * p, std::size_t n) noexcept
	{
		assert(pointer_in_buffer(m_ptr) && "short_alloc has outlived arena");
		if (pointer_in_buffer(p))
		{
			n = align_up(n);
			if (p + n == m_ptr)
				m_ptr = p;
		}
		else
			Jinx::MemFree(p, n);
	}